

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O1

int lgx_str_init(lgx_str_t *str,uint size)

{
  char *pcVar1;
  int iVar2;
  
  str->size = 0;
  str->length = 0;
  str->buffer = (char *)0x0;
  iVar2 = 0;
  if (size != 0) {
    pcVar1 = (char *)malloc((ulong)size);
    str->buffer = pcVar1;
    if (pcVar1 == (char *)0x0) {
      iVar2 = 1;
    }
    else {
      str->size = size;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int lgx_str_init(lgx_str_t* str, unsigned size) {
    memset(str, 0, sizeof(lgx_str_t));

    if (size > 0) {
        str->buffer = xmalloc(size);
        if (!str->buffer) {
            return 1;
        }

        str->size = size;
    }

    return 0;
}